

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall SQCompilation::CodegenVisitor::visitTerExpr(CodegenVisitor *this,TerExpr *expr)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  SQFuncState *this_00;
  SQInteger SVar4;
  SQInteger SVar5;
  ulong pos;
  ulong pos_00;
  
  maybeAddInExprLine(this,&expr->super_Expr);
  visitForceGet(this,&expr->_a->super_Node);
  this_00 = this->_fs;
  SVar4 = SQFuncState::PopTarget(this_00);
  SQFuncState::AddInstruction(this_00,_OP_JZ,SVar4,0,0,0);
  sVar1 = (this->_fs->_instructions)._size;
  SVar4 = SQFuncState::PushTarget(this->_fs,-1);
  visitForceGet(this,&expr->_b->super_Node);
  SVar5 = SQFuncState::PopTarget(this->_fs);
  if (SVar4 != SVar5) {
    SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar4,SVar5,0,0);
  }
  sVar2 = (this->_fs->_instructions)._size;
  SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,0,0,0);
  sVar3 = (this->_fs->_instructions)._size;
  visitForceGet(this,&expr->_c->super_Node);
  SVar5 = SQFuncState::PopTarget(this->_fs);
  if (SVar4 != SVar5) {
    SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar4,SVar5,0,0);
  }
  pos = (ulong)(sVar3 - 1);
  pos_00 = (ulong)(sVar1 - 1);
  SQFuncState::SetInstructionParam(this->_fs,pos,1,((this->_fs->_instructions)._size - 1) - pos);
  SQFuncState::SetInstructionParam(this->_fs,pos_00,1,((sVar2 - 1) - pos_00) + 1);
  this->_fs->_optimization = false;
  return;
}

Assistant:

void CodegenVisitor::visitTerExpr(TerExpr *expr) {
    maybeAddInExprLine(expr);
    assert(expr->op() == TO_TERNARY);

    visitForceGet(expr->a());
    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jzpos = _fs->GetCurrentPos();

    SQInteger trg = _fs->PushTarget();
    visitForceGet(expr->b());
    SQInteger first_exp = _fs->PopTarget();
    if (trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
    SQInteger endfirstexp = _fs->GetCurrentPos();
    _fs->AddInstruction(_OP_JMP, 0, 0);
    SQInteger jmppos = _fs->GetCurrentPos();

    visitForceGet(expr->c());
    SQInteger second_exp = _fs->PopTarget();
    if (trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);

    _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    _fs->SetInstructionParam(jzpos, 1, endfirstexp - jzpos + 1);
    _fs->SnoozeOpt();
}